

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_clear_fd(intptr_t fd,uint8_t is_open)

{
  void *arg2;
  long lVar1;
  fio_protocol_s *pfVar2;
  void *__dest;
  size_t sVar3;
  long *local_120;
  fio_uuid_links__ordered_s_ *pos;
  fio_packet_s *tmp;
  long local_108;
  undefined1 local_e4;
  char local_e3;
  undefined1 local_e2;
  uint8_t local_e1;
  fio_rw_hook_s *local_a8;
  undefined1 local_68 [8];
  fio_uuid_links_s links;
  void *rw_udata;
  fio_rw_hook_s *rw_hooks;
  fio_protocol_s *protocol;
  fio_packet_s *packet;
  uint8_t is_open_local;
  intptr_t fd_local;
  
  fio_lock((fio_lock_i *)((long)fio_data + fd * 0xa8 + 0x6e));
  memcpy(local_68,(void *)((long)fio_data + fd * 0xa8 + 0xb8),0x30);
  protocol = *(fio_protocol_s **)((long)fio_data + fd * 0xa8 + 0x40);
  arg2 = *(void **)((long)fio_data + fd * 0xa8 + 0x58);
  lVar1 = *(long *)((long)fio_data + fd * 0xa8 + 0xa8);
  links._40_8_ = *(undefined8 *)((long)fio_data + fd * 0xa8 + 0xb0);
  __dest = (void *)((long)fio_data + fd * 0xa8 + 0x40);
  memset(&tmp,0,0xa8);
  local_108 = (long)fio_data + fd * 0xa8 + 0x40;
  local_e4 = *(undefined1 *)((long)fio_data + fd * 0xa8 + 0x6c);
  local_e3 = *(char *)((long)fio_data + fd * 0xa8 + 0x6d) + '\x01';
  local_e2 = *(undefined1 *)((long)fio_data + fd * 0xa8 + 0x6e);
  local_a8 = &FIO_DEFAULT_RW_HOOKS;
  local_e1 = is_open;
  memcpy(__dest,&tmp,0xa8);
  fio_unlock((fio_lock_i *)((long)fio_data + fd * 0xa8 + 0x6e));
  if ((lVar1 != 0) && (*(long *)(lVar1 + 0x20) != 0)) {
    (**(code **)(lVar1 + 0x20))(links._40_8_);
  }
  while (protocol != (fio_protocol_s *)0x0) {
    pfVar2 = (fio_protocol_s *)protocol->on_data;
    fio_packet_free((fio_packet_s *)protocol);
    protocol = pfVar2;
  }
  sVar3 = fio_uuid_links_count((fio_uuid_links_s *)local_68);
  if (sVar3 != 0) {
    for (local_120 = (long *)links.pos;
        local_120 != (long *)0x0 && local_120 < (long *)(links.pos + links.capa * 0x10);
        local_120 = local_120 + 2) {
      if (*local_120 != 0) {
        (*(code *)local_120[1])(*local_120);
      }
    }
  }
  fio_uuid_links_free((fio_uuid_links_s *)local_68);
  if ((arg2 != (void *)0x0) && (*(long *)((long)arg2 + 0x18) != 0)) {
    fio_defer(deferred_on_close,
              (void *)(fd << 8 | (ulong)*(byte *)((long)fio_data + fd * 0xa8 + 0x6d)),arg2);
  }
  if (is_open != '\0') {
    fio_max_fd_min((uint32_t)fd);
  }
  return 0;
}

Assistant:

static inline int fio_clear_fd(intptr_t fd, uint8_t is_open) {
  fio_packet_s *packet;
  fio_protocol_s *protocol;
  fio_rw_hook_s *rw_hooks;
  void *rw_udata;
  fio_uuid_links_s links;
  fio_lock(&(fd_data(fd).sock_lock));
  links = fd_data(fd).links;
  packet = fd_data(fd).packet;
  protocol = fd_data(fd).protocol;
  rw_hooks = fd_data(fd).rw_hooks;
  rw_udata = fd_data(fd).rw_udata;
  fd_data(fd) = (fio_fd_data_s){
      .open = is_open,
      .sock_lock = fd_data(fd).sock_lock,
      .protocol_lock = fd_data(fd).protocol_lock,
      .rw_hooks = (fio_rw_hook_s *)&FIO_DEFAULT_RW_HOOKS,
      .counter = fd_data(fd).counter + 1,
      .packet_last = &fd_data(fd).packet,
  };
  fio_unlock(&(fd_data(fd).sock_lock));
  if (rw_hooks && rw_hooks->cleanup)
    rw_hooks->cleanup(rw_udata);
  while (packet) {
    fio_packet_s *tmp = packet;
    packet = packet->next;
    fio_packet_free(tmp);
  }
  if (fio_uuid_links_count(&links)) {
    FIO_SET_FOR_LOOP(&links, pos) {
      if (pos->hash)
        pos->obj((void *)pos->hash);
    }
  }
  fio_uuid_links_free(&links);
  if (protocol && protocol->on_close) {
    fio_defer(deferred_on_close, (void *)fd2uuid(fd), protocol);
  }
  if (is_open)
    fio_max_fd_min(fd);
  return 0;
}